

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O2

void __thiscall agge::tests::ArcCurveTests::FirstElementIsALineToTheEndPoint(ArcCurveTests *this)

{
  int iVar1;
  real_t y;
  real_t x;
  arc a2;
  arc a1;
  allocator local_b1;
  real_t local_b0;
  float local_ac;
  float local_a8 [8];
  float local_88 [11];
  real_t local_5c;
  arc local_58;
  arc local_38;
  
  local_b0 = 3.1415927;
  local_ac = 0.0;
  local_5c = 1.5707964;
  arc::arc(&local_38,13.1,-17.2,10.1,0.0,1.5707964,0.05);
  arc::arc(&local_58,-122.3,19.4,17.3,local_5c,local_b0,0.05);
  local_b0 = 0.0;
  while( true ) {
    iVar1 = arc::vertex(&local_38,local_88,local_a8);
    if (iVar1 == 0) break;
    local_ac = local_88[0];
    local_b0 = local_a8[0];
  }
  std::__cxx11::string::string
            ((string *)local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_b1);
  ut::LocationInfo::LocationInfo((LocationInfo *)local_88,(string *)local_a8,0x13a);
  ut::are_approx_equal<float>(13.1,local_ac,1e-05,(LocationInfo *)local_88);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string
            ((string *)local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_b1);
  ut::LocationInfo::LocationInfo((LocationInfo *)local_88,(string *)local_a8,0x13b);
  ut::are_approx_equal<float>(-7.1,local_b0,1e-05,(LocationInfo *)local_88);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  while( true ) {
    iVar1 = arc::vertex(&local_58,local_88,local_a8);
    if (iVar1 == 0) break;
    local_ac = local_88[0];
    local_b0 = local_a8[0];
  }
  std::__cxx11::string::string
            ((string *)local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_b1);
  ut::LocationInfo::LocationInfo((LocationInfo *)local_88,(string *)local_a8,0x142);
  ut::are_approx_equal<float>(-139.6,local_ac,1e-05,(LocationInfo *)local_88);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string
            ((string *)local_a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_b1);
  ut::LocationInfo::LocationInfo((LocationInfo *)local_88,(string *)local_a8,0x143);
  ut::are_approx_equal<float>(19.4,local_b0,1e-05,(LocationInfo *)local_88);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( FirstElementIsALineToTheEndPoint )
			{
				// INIT
				arc a1(13.1f, -17.2f, 10.1f, 0.0f * pi, 0.5f * pi);
				arc a2(-122.3f, 19.4f, 17.3f, 0.5f * pi, 1.0f * pi);
				real_t prev_x = 0.0f, prev_y = 0.0f;

				// ACT
				for (real_t x, y; path_command_stop != a1.vertex(&x, &y); )
					prev_x = x, prev_y = y;

				// ASSERT
				assert_approx_equal(13.1f, prev_x, 0.00001);
				assert_approx_equal(-7.1f, prev_y, 0.00001);

				// ACT
				for (real_t x, y; path_command_stop != a2.vertex(&x, &y); )
					prev_x = x, prev_y = y;

				// ASSERT
				assert_approx_equal(-139.6f, prev_x, 0.00001);
				assert_approx_equal(19.4f, prev_y, 0.00001);
			}